

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_texture_thumbnail.cxx
# Opt level: O0

bool __thiscall
xray_re::xr_texture_thumbnail::load(xr_texture_thumbnail *this,char *path,char *name)

{
  bool bVar1;
  xr_reader *local_38;
  xr_reader *r;
  xr_file_system *fs;
  char *name_local;
  char *path_local;
  xr_texture_thumbnail *this_local;
  
  fs = (xr_file_system *)name;
  name_local = path;
  path_local = (char *)this;
  r = (xr_reader *)xr_file_system::instance();
  local_38 = xr_file_system::r_open((xr_file_system *)r,name_local,(char *)fs);
  bVar1 = local_38 != (xr_reader *)0x0;
  if (bVar1) {
    load(this,local_38);
    xr_file_system::r_close((xr_file_system *)r,&local_38);
  }
  return bVar1;
}

Assistant:

bool xr_texture_thumbnail::load(const char* path, const char* name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path, name);
	if (r == 0)
		return false;
	load(*r);
	fs.r_close(r);
	return true;
}